

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O2

void __thiscall
SGParser::Generator::StdGrammarParseData::CreateLexemes
          (StdGrammarParseData *this,
          vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *lexemes)

{
  pointer pLVar1;
  uint tokenCode;
  uint uVar2;
  long lVar3;
  String local_98;
  String local_78;
  char *local_58;
  char **local_50;
  vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *local_48;
  char *local_40;
  allocator<char> local_32;
  allocator<char> local_31;
  
  local_48 = lexemes;
  std::vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>::resize(lexemes,0x24);
  uVar2 = 2;
  local_50 = &CreateLexemes::init[0].RegulaRegExpr;
  for (lVar3 = 0; lVar3 != 0xea0; lVar3 = lVar3 + 0x68) {
    pLVar1 = (local_48->super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_40 = ((LexemeInit *)(local_50 + -1))->Name;
    local_58 = *local_50;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,local_40,&local_32);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,local_58,&local_31);
    tokenCode = uVar2;
    if (*local_40 == '\0') {
      tokenCode = 0;
    }
    Lexeme::SetLexeme((Lexeme *)((long)&(pLVar1->Name)._M_dataplus._M_p + lVar3),&local_98,&local_78
                      ,tokenCode);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    uVar2 = (uVar2 + 1) - (uint)(*local_40 == '\0');
    local_50 = local_50 + 2;
  }
  return;
}

Assistant:

void StdGrammarParseData::CreateLexemes(std::vector<Lexeme>& lexemes) {
    // Create the hard-coded internal lexemes structure
    static constexpr size_t LexemeCount = 36u;
    static constexpr struct LexemeInit {
        const char* Name;
        const char* RegulaRegExpr;
    } init[LexemeCount]=
    {
      {"bad_char",         "[^ \r\n\t]"              },
      {"",                 "[ \t\r\n]+"              }, // whitespace
      {"number_int",       "[0-9]+"                  },
      {"string_cons",      "\"[^\"]*\""              },
      {"identifier",       "[A-Za-z_][A-Za-z0-9_]*"  },
      {"",                 "\\/\\/.*"                }, // single line comment
      {"macro",            "%macro"                  },

      {"expression",       "%expression"             },
      {"ignore",           "%ignore"                 },
      {"push",             "%push"                   },
      {"pop",              "%pop"                    },
      {"goto",             "%goto"                   },

      {"prec",             "%prec"                   },
      {"left",             "%left"                   },
      {"right",            "%right"                  },
      {"nonassoc",         "%nonassoc"               },

      {"production",       "%production"             },
      {"shifton",          "%shifton"                },
      {"reduceon",         "%reduceon"               },
      {"reduce",           "%reduce"                 },
      {"action",           "%action"                 },
      {"error",            "%error",                 },
      {"error_backtrack",  "%error_backtrack",       },

      {",",                ","                       },
      {";",                ";"                       },
      {"?",                "\\?"                     },
      {"&",                "\\&"                     },
      {"|",                "\\|"                     },
      {"{",                "\\{"                     },
      {"}",                "\\}"                     },
      {"(",                "\\("                     },
      {")",                "\\)"                     },
      {">",                ">"                       },
      {"->",               "\\-\\>"                  },
      {"quote_cons",       "\'((\'\')|[^\'\n\r])*\'" },

      // Expression from the web (old one did not seem to work):
      // /\*[^*]*\*+([^/*][^*]*\*+)*/
      {"",                 "\\/\\*[^\\*]*\\*+([^\\/\\*][^\\*]*\\*+)*\\/" }  // Multi-line comment
      // Improvements:
      // Ideally we have lazy loops (x*?): "/\\*.*?\\*/"
      // Second best, if we have possessive qualifiers (x*+):
      // "/\\*[^*]*+\\*++([^/][^*]*+\\*++)*+/"
      // Worst case, we can at least remove unnecessary backslashes:
      // "/\\*[^*]*\\*+([^/\\*][^*]*\\*+)*/"
    };

    unsigned idCount = TokenCode::TokenFirstID;
    lexemes.resize(LexemeCount);
    for (size_t i = 0u; i < LexemeCount; ++i) {
        lexemes[i].SetLexeme(init[i].Name, init[i].RegulaRegExpr, init[i].Name[0u] ? idCount : 0u);
        if (init[i].Name[0u])
            ++idCount;
    }
}